

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O2

void __thiscall
shift_window_transformer::WindowAttention<float>::forward
          (WindowAttention<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  pointer pfVar5;
  Tensor<int> *pTVar6;
  pointer piVar7;
  Tensor<float> *pTVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int *piVar12;
  int i_2;
  ulong uVar13;
  ulong uVar14;
  pointer pfVar15;
  ulong uVar16;
  int j;
  pointer pfVar17;
  int pi_1;
  int iVar18;
  ulong uVar19;
  const_iterator __position;
  int pos;
  int iVar20;
  int iVar21;
  int pi;
  int iVar22;
  int iVar23;
  pointer pfVar24;
  int i;
  long lVar25;
  int i_1;
  int iVar26;
  long lVar27;
  int pj;
  int iVar28;
  ulong uVar29;
  bool bVar30;
  float fVar31;
  long local_2d0;
  Tensor<float> dots;
  Tensor<float> tmp;
  Tensor<float> tmp3;
  Tensor<float> v;
  Tensor<float> tmp4;
  Tensor<float> tmp2;
  Tensor<float> k;
  Tensor<float> q;
  Tensor<float> vTmp;
  Tensor<float> kTmp;
  Tensor<float> attn;
  Tensor<float> qTmp;
  
  tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->shifted == true) {
    (*(code *)**(undefined8 **)this->cyclicShift)(this->cyclicShift,input,&tmp);
  }
  else {
    std::vector<float,std::allocator<float>>::
    insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
              ((vector<float,std::allocator<float>> *)&tmp,(const_iterator)0x0,
               (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
               (input->super_vector<float,_std::allocator<float>_>).
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                         )(input->super_vector<float,_std::allocator<float>_>).
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)&tmp.shape,
               (const_iterator)
               tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               (input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               (input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  qTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  qTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  qTmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  qTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  qTmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  qTmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  kTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  kTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  kTmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  kTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  kTmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  kTmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vTmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vTmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vTmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (**(this->qLinear->super_Layer<float>)._vptr_Layer)(this->qLinear,&tmp);
  (**(this->kLinear->super_Layer<float>)._vptr_Layer)(this->kLinear,&tmp,&kTmp);
  (**(this->kLinear->super_Layer<float>)._vptr_Layer)(this->kLinear,&tmp,&vTmp);
  q.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  q.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  q.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  q.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  q.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  q.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  k.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  k.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  k.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  k.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  k.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  k.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  v.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = this->windowSize;
  iVar2 = *qTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar9 = qTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[1] / iVar1;
  reArrange(this,&qTmp,&q);
  reArrange(this,&kTmp,&k);
  reArrange(this,&vTmp,&v);
  dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dots.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  dots.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dots.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = q.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish[-2];
  uVar4 = q.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish[-1];
  std::vector<int,_std::allocator<int>_>::operator=(&dots.shape,&q.shape);
  dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [-1] = dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish[-2];
  local_2d0 = 0;
  uVar19 = 0;
  if (0 < (int)uVar4) {
    uVar19 = (ulong)uVar4;
  }
  uVar13 = 0;
  if (0 < (int)uVar3) {
    uVar13 = (ulong)uVar3;
  }
  for (uVar14 = 0;
      uVar14 < (ulong)((long)q.super_vector<float,_std::allocator<float>_>.
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)q.super_vector<float,_std::allocator<float>_>.
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2);
      uVar14 = uVar14 + (long)(int)(uVar4 * uVar3)) {
    lVar27 = local_2d0;
    for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
      lVar25 = local_2d0;
      for (uVar29 = 0; uVar29 != uVar3; uVar29 = uVar29 + 1) {
        attn.super_vector<float,_std::allocator<float>_>.
        super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)attn.super_vector<float,_std::allocator<float>_>.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start & 0xffffffff00000000);
        fVar31 = 0.0;
        for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
          fVar31 = fVar31 + *(float *)((long)q.super_vector<float,_std::allocator<float>_>.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start +
                                      uVar16 * 4 + lVar27) *
                            *(float *)((long)k.super_vector<float,_std::allocator<float>_>.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start +
                                      uVar16 * 4 + lVar25);
          attn.super_vector<float,_std::allocator<float>_>.
          super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
               = (pointer)CONCAT44(attn.super_vector<float,_std::allocator<float>_>.
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,fVar31);
        }
        std::vector<float,_std::allocator<float>_>::push_back
                  (&dots.super_vector<float,_std::allocator<float>_>,(value_type_conflict2 *)&attn);
        lVar25 = lVar25 + (long)(int)uVar4 * 4;
      }
      lVar27 = lVar27 + (long)(int)uVar4 * 4;
    }
    local_2d0 = local_2d0 + (long)(int)(uVar4 * uVar3) * 4;
  }
  pfVar5 = (this->posEmbedding->super_vector<float,_std::allocator<float>_>).
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar19 = (long)(this->posEmbedding->super_vector<float,_std::allocator<float>_>).
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)pfVar5 >> 2;
  if (this->relativePosEmbedding == false) {
    uVar14 = (ulong)(uVar3 * uVar3);
    if (uVar19 != uVar14) {
      __assert_fail("posEmbedding->size() == matX * matX",
                    "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/window_attention.h"
                    ,0x8b,
                    "virtual void shift_window_transformer::WindowAttention<float>::forward(const Tensor<T> &, Tensor<T> &) [T = float]"
                   );
    }
    pfVar24 = dots.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start;
    for (uVar19 = 0;
        uVar19 < (ulong)((long)dots.super_vector<float,_std::allocator<float>_>.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)dots.super_vector<float,_std::allocator<float>_>.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2); uVar19 = uVar19 + uVar14) {
      pfVar15 = pfVar24;
      pfVar17 = pfVar5;
      for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
        for (uVar29 = 0; uVar3 != uVar29; uVar29 = uVar29 + 1) {
          pfVar15[uVar29] = pfVar17[uVar29] + pfVar15[uVar29];
        }
        pfVar17 = pfVar17 + (int)uVar3;
        pfVar15 = pfVar15 + (int)uVar3;
      }
      pfVar24 = pfVar24 + uVar14;
    }
  }
  else {
    lVar27 = (long)this->windowSize * 2 + -1;
    iVar18 = (int)lVar27;
    if (uVar19 != (uint)(iVar18 * iVar18)) {
      __assert_fail("posEmbedding->size() == (2 * windowSize - 1) * (2 * windowSize - 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/window_attention.h"
                    ,0x80,
                    "virtual void shift_window_transformer::WindowAttention<float>::forward(const Tensor<T> &, Tensor<T> &) [T = float]"
                   );
    }
    pfVar24 = dots.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start;
    for (uVar19 = 0;
        uVar19 < (ulong)((long)dots.super_vector<float,_std::allocator<float>_>.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)dots.super_vector<float,_std::allocator<float>_>.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2);
        uVar19 = uVar19 + (long)(int)(uVar3 * uVar3)) {
      iVar18 = 1;
      pfVar15 = pfVar24;
      for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
        pTVar6 = this->relativeIndices;
        iVar28 = iVar18;
        for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
          piVar7 = (pTVar6->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          pfVar15[uVar11] =
               pfVar5[(long)piVar7[iVar28] + piVar7[iVar28 + -1] * lVar27] + pfVar15[uVar11];
          iVar28 = iVar28 + 2;
        }
        pfVar15 = pfVar15 + (int)uVar3;
        iVar18 = iVar18 + uVar3 * 2;
      }
      pfVar24 = pfVar24 + (int)(uVar3 * uVar3);
    }
  }
  if (this->shifted == true) {
    uVar19 = (long)dots.super_vector<float,_std::allocator<float>_>.
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_finish -
             (long)dots.super_vector<float,_std::allocator<float>_>.
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start >> 2;
    iVar18 = *dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (uVar13 = 0; uVar13 < uVar19; uVar13 = uVar13 + (long)(int)(uVar19 / (ulong)(long)iVar18)) {
      iVar28 = dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[1];
      for (iVar22 = iVar28 - iVar9; iVar23 = iVar9 + -1, iVar22 < iVar28; iVar22 = iVar22 + 1) {
        iVar23 = dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[2];
        iVar26 = 0;
        iVar20 = iVar23;
        if (iVar23 < 1) {
          iVar20 = iVar26;
        }
        for (; iVar26 != iVar20; iVar26 = iVar26 + 1) {
          uVar3 = dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[3];
          pTVar8 = this->upperLowerMask;
          uVar14 = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            uVar14 = 0;
          }
          lVar27 = (long)(int)(uVar3 * iVar26);
          iVar10 = 0;
          while (bVar30 = uVar14 != 0, uVar14 = uVar14 - 1, bVar30) {
            iVar21 = iVar10 + (int)uVar13 + iVar23 * iVar22 * uVar3 + uVar3 * iVar26;
            dots.super_vector<float,_std::allocator<float>_>.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar21] =
                 (pTVar8->super_vector<float,_std::allocator<float>_>).
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar27] +
                 dots.super_vector<float,_std::allocator<float>_>.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start[iVar21];
            iVar10 = iVar10 + 1;
            lVar27 = lVar27 + 1;
          }
        }
      }
      for (; iVar23 < iVar28; iVar23 = iVar23 + iVar9) {
        iVar22 = dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[2];
        iVar26 = 0;
        iVar20 = iVar22;
        if (iVar22 < 1) {
          iVar20 = iVar26;
        }
        for (; iVar26 != iVar20; iVar26 = iVar26 + 1) {
          uVar3 = dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[3];
          pTVar8 = this->leftRightMask;
          uVar14 = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            uVar14 = 0;
          }
          lVar27 = (long)(int)(uVar3 * iVar26);
          iVar10 = 0;
          while (bVar30 = uVar14 != 0, uVar14 = uVar14 - 1, bVar30) {
            iVar21 = iVar10 + (int)uVar13 + iVar22 * iVar23 * uVar3 + uVar3 * iVar26;
            dots.super_vector<float,_std::allocator<float>_>.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar21] =
                 (pTVar8->super_vector<float,_std::allocator<float>_>).
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar27] +
                 dots.super_vector<float,_std::allocator<float>_>.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start[iVar21];
            iVar10 = iVar10 + 1;
            lVar27 = lVar27 + 1;
          }
        }
      }
    }
  }
  attn.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  attn.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  attn.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attn.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  attn.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attn.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SoftMax<float>::forward(&this->softMax,&dots,&attn);
  tmp2.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  tmp2.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tmp2.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp2.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  tmp2.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp2.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::operator=(&tmp2.shape,&v.shape);
  piVar12 = dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start;
  for (iVar18 = 0; iVar18 < piVar12[1] * *piVar12; iVar18 = iVar18 + 1) {
    for (iVar28 = 0; iVar28 < piVar12[2]; iVar28 = iVar28 + 1) {
      for (iVar22 = 0;
          iVar22 < v.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[3]; iVar22 = iVar22 + 1) {
        tmp3.super_vector<float,_std::allocator<float>_>.
        super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)tmp3.super_vector<float,_std::allocator<float>_>.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start & 0xffffffff00000000);
        iVar23 = dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[3];
        iVar20 = 0;
        if (0 < iVar23) {
          iVar20 = iVar23;
        }
        fVar31 = 0.0;
        for (lVar27 = 0; iVar20 != (int)lVar27; lVar27 = lVar27 + 1) {
          fVar31 = fVar31 + dots.super_vector<float,_std::allocator<float>_>.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start
                            [(dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[2] * iVar18 + iVar28) * iVar23 +
                             lVar27] *
                            v.super_vector<float,_std::allocator<float>_>.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start
                            [(v.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[2] * iVar18 + (int)lVar27) *
                             v.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[3] + iVar22];
          tmp3.super_vector<float,_std::allocator<float>_>.
          super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
               = (pointer)CONCAT44(tmp3.super_vector<float,_std::allocator<float>_>.
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,fVar31);
        }
        std::vector<float,_std::allocator<float>_>::push_back
                  (&tmp2.super_vector<float,_std::allocator<float>_>,(value_type_conflict2 *)&tmp3);
      }
      piVar12 = dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
  }
  tmp3.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  tmp3.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tmp3.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp3.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  tmp3.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp3.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize
            (&tmp3.super_vector<float,_std::allocator<float>_>,
             (long)tmp2.super_vector<float,_std::allocator<float>_>.
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_finish -
             (long)tmp2.super_vector<float,_std::allocator<float>_>.
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start >> 2);
  std::vector<int,_std::allocator<int>_>::operator=(&tmp3.shape,&qTmp.shape);
  iVar18 = this->windowSize;
  iVar28 = this->headDim;
  iVar22 = this->heads;
  for (uVar19 = 0;
      (long)tmp2.super_vector<float,_std::allocator<float>_>.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)tmp2.super_vector<float,_std::allocator<float>_>.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start >> 2 != uVar19; uVar19 = uVar19 + 1) {
    uVar13 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
    uVar14 = (long)uVar13 / (long)iVar28;
    uVar14 = (ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff;
    uVar11 = (long)uVar14 / (long)iVar18;
    uVar11 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
    uVar29 = (long)uVar11 / (long)iVar18;
    uVar29 = (ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 | uVar29 & 0xffffffff;
    uVar16 = (long)uVar29 / (long)iVar9;
    lVar27 = (long)(iVar2 / iVar1);
    uVar16 = (ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff;
    tmp3.super_vector<float,_std::allocator<float>_>.
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [(((int)((long)uVar11 % (long)iVar18) * iVar18 + (int)((long)uVar14 % (long)iVar18) +
       (int)((long)uVar29 % (long)iVar9) * iVar18 * iVar18 +
      (int)((long)uVar16 % lVar27) * iVar9 * iVar18 * iVar18) * iVar22 +
     (int)((long)uVar16 / lVar27)) * iVar28 + (int)((long)uVar13 % (long)iVar28)] =
         tmp2.super_vector<float,_std::allocator<float>_>.
         super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         [uVar19];
  }
  tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tmp4.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  tmp4.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp4.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (**(this->outLinear->super_Layer<float>)._vptr_Layer)(this->outLinear,&tmp3);
  if (this->shifted == true) {
    (*(code *)**(undefined8 **)this->cyclicBackShift)(this->cyclicBackShift,&tmp4,output);
  }
  else {
    pfVar5 = (output->super_vector<float,_std::allocator<float>_>).
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
    __position._M_current =
         (output->super_vector<float,_std::allocator<float>_>).
         super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    if (__position._M_current != pfVar5) {
      (output->super_vector<float,_std::allocator<float>_>).
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
           pfVar5;
      __position._M_current = pfVar5;
    }
    piVar7 = (output->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((output->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar7) {
      (output->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar7;
    }
    std::vector<float,std::allocator<float>>::
    insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,void>
              ((vector<float,std::allocator<float>> *)output,__position,
               (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
               tmp4.super_vector<float,_std::allocator<float>_>.
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                        tmp4.super_vector<float,_std::allocator<float>_>.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)&output->shape,
               (const_iterator)
               (output->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  Tensor<float>::~Tensor(&tmp4);
  Tensor<float>::~Tensor(&tmp3);
  Tensor<float>::~Tensor(&tmp2);
  Tensor<float>::~Tensor(&attn);
  Tensor<float>::~Tensor(&dots);
  Tensor<float>::~Tensor(&v);
  Tensor<float>::~Tensor(&k);
  Tensor<float>::~Tensor(&q);
  Tensor<float>::~Tensor(&vTmp);
  Tensor<float>::~Tensor(&kTmp);
  Tensor<float>::~Tensor(&qTmp);
  Tensor<float>::~Tensor(&tmp);
  return;
}

Assistant:

void forward(const Tensor<T> &input, Tensor<T> &output) {
            Tensor<T> tmp{};
            if (shifted) {
                cyclicShift->forward(input, tmp);
            } else {
                tmp.insert(tmp.end(), input.begin(), input.end());
                tmp.shape.insert(tmp.shape.end(), input.shape.begin(), input.shape.end());
            }
            Tensor<T> qTmp{};
            Tensor<T> kTmp{};
            Tensor<T> vTmp{};
            qLinear->forward(tmp, qTmp);
            kLinear->forward(tmp, kTmp);
            kLinear->forward(tmp, vTmp);
            Tensor<T> q{}, k{}, v{};
            int nw_h = qTmp.shape[0] / windowSize, nw_w = qTmp.shape[1] / windowSize;
            reArrange(qTmp, q);
            reArrange(kTmp, k);
            reArrange(vTmp, v);
            Tensor<T> dots{};
            int matX = q.shape[q.shape.size() - 2];
            int matY = q.shape[q.shape.size() - 1];
            dots.shape = q.shape;
            dots.shape[dots.shape.size() - 1] = dots.shape[dots.shape.size() - 2];
            for (int pos = 0; pos < q.size(); pos += matX * matY) {
                for (int pi = 0; pi < matX; ++pi) {
                    for (int pj = 0; pj < matX; ++pj) {
                        T val = 0;
                        for (int pk = 0; pk < matY; ++pk) {
                            val += q[pos + pi * matY + pk] * k[pos + pj * matY + pk];
                        }
                        dots.push_back(val);
                    }
                }
            }

            if (relativePosEmbedding) {
                assert(posEmbedding->size() == (2 * windowSize - 1) * (2 * windowSize - 1));
                for (int pos = 0; pos < dots.size(); pos += matX * matX) {
                    for (int i = 0; i < matX; ++i) {
                        for (int j = 0; j < matX; ++j) {
                            dots[pos + i * matX + j] += (*posEmbedding)[
                                    (*relativeIndices)[i * matX * 2 + j * 2] * (2 * windowSize - 1) +
                                    (*relativeIndices)[i * matX * 2 + j * 2 + 1]];
                        }
                    }
                }
            } else {
                assert(posEmbedding->size() == matX * matX);
                for (int pos = 0; pos < dots.size(); pos += matX * matX) {
                    for (int i = 0; i < matX; ++i) {
                        for (int j = 0; j < matX; ++j) {
                            dots[pos + i * matX + j] += (*posEmbedding)[i * matX + j];
                        }
                    }
                }
            }

            if (shifted) {
                int batch = dots.size() / dots.shape[0];
                for (int pos = 0; pos < dots.size(); pos += batch) {
                    for (int pi = dots.shape[1] - nw_w; pi < dots.shape[1]; ++pi) {
                        for (int pj = 0; pj < dots.shape[2]; ++pj) {
                            for (int pk = 0; pk < dots.shape[3]; ++pk) {
                                dots[pos + pi * dots.shape[2] * dots.shape[3] + pj * dots.shape[3] +
                                     pk] += (*upperLowerMask)[pj * dots.shape[3] + pk];
                            }
                        }
                    }
                    for (int pi = nw_w - 1; pi < dots.shape[1]; pi += nw_w) {
                        for (int pj = 0; pj < dots.shape[2]; ++pj) {
                            for (int pk = 0; pk < dots.shape[3]; ++pk) {
                                dots[pos + pi * dots.shape[2] * dots.shape[3] + pj * dots.shape[3] +
                                     pk] += (*leftRightMask)[pj * dots.shape[3] + pk];
                            }
                        }
                    }
                }
            }
            Tensor<T> attn{};
            softMax.forward(dots, attn);
            Tensor<T> tmp2{};
            tmp2.shape = v.shape;
            for (int pos = 0; pos < dots.shape[0] * dots.shape[1]; ++pos) {
                for (int pi = 0; pi < dots.shape[2]; ++pi) {
                    for (int pj = 0; pj < v.shape[3]; ++pj) {
                        T val = 0;
                        for (int pk = 0; pk < dots.shape[3]; ++pk) {
                            val += dots[pos * dots.shape[2] * dots.shape[3] + pi * dots.shape[3] + pk] *
                                   v[pos * v.shape[2] * v.shape[3] + pk * v.shape[3] + pj];
                        }
                        tmp2.push_back(val);
                    }
                }
            }
            Tensor<T> tmp3{};
            tmp3.resize(tmp2.size());
            tmp3.shape = qTmp.shape;
            for (int i = 0; i < tmp2.size(); ++i) {
                int d = i % headDim;
                int w_w = i / headDim % windowSize;
                int w_h = i / headDim / windowSize % windowSize;
                int mw_w = i / headDim / windowSize / windowSize % nw_w;
                int mw_h = i / headDim / windowSize / windowSize / nw_w % nw_h;
                int h = i / headDim / windowSize / windowSize / nw_w / nw_h;
                int new_pos = d + h * headDim +
                              w_w * headDim * heads +
                              w_h * windowSize * headDim * heads +
                              mw_w * windowSize * windowSize * headDim * heads +
                              mw_h * nw_w * windowSize * windowSize * headDim * heads;
                tmp3[new_pos] = tmp2[i];
            }
            Tensor<T> tmp4{};
            outLinear->forward(tmp3, tmp4);

            if (shifted) {
                cyclicBackShift->forward(tmp4, output);
            } else {
                output.clear();
                output.shape.clear();
                output.insert(output.end(), tmp4.begin(), tmp4.end());
                output.shape.insert(output.shape.end(), tmp4.shape.begin(), tmp4.shape.end());
            }
        }